

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

errr finish_parse_history(parser *p)

{
  history_entry *phVar1;
  history_chart *phVar2;
  history_entry *next;
  history_entry *prev;
  history_entry *e;
  history_chart *c;
  parser *p_local;
  
  histories = (history_chart *)parser_priv(p);
  e = (history_entry *)histories;
  do {
    if (e == (history_entry *)0x0) {
      parser_destroy(p);
      return 0;
    }
    next = (history_entry *)0x0;
    prev = (history_entry *)e->succ;
    while (prev != (history_entry *)0x0) {
      phVar1 = prev->next;
      prev->next = next;
      next = prev;
      prev = phVar1;
    }
    e->succ = (history_chart *)next;
    for (prev = (history_entry *)e->succ; prev != (history_entry *)0x0; prev = prev->next) {
      if (prev->isucc != L'\0') {
        phVar2 = findchart(histories,prev->isucc);
        prev->succ = phVar2;
        if (prev->succ == (history_chart *)0x0) {
          return -1;
        }
      }
    }
    e = e->next;
  } while( true );
}

Assistant:

static errr finish_parse_history(struct parser *p) {
	struct history_chart *c;
	struct history_entry *e, *prev, *next;
	histories = parser_priv(p);

	/* Go fix up the entry successor pointers. We can't compute them at
	 * load-time since we may not have seen the successor history yet. Also,
	 * we need to put the entries in the right order; the parser actually
	 * stores them backwards, which is not desirable.
	 */
	for (c = histories; c; c = c->next) {
		e = c->entries;
		prev = NULL;
		while (e) {
			next = e->next;
			e->next = prev;
			prev = e;
			e = next;
		}
		c->entries = prev;
		for (e = c->entries; e; e = e->next) {
			if (!e->isucc)
				continue;
			e->succ = findchart(histories, e->isucc);
			if (!e->succ) {
				return -1;
			}
		}
	}

	parser_destroy(p);
	return 0;
}